

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O1

uint64_t c_prim_eval(char *script)

{
  uint64_t uVar1;
  runtime_error *this;
  repl_data *in_RCX;
  environment_map *env;
  _Alloc_hider this_00;
  fptr f;
  uint64_t size;
  allocator<char> local_41;
  fptr local_40;
  uint64_t local_38;
  string local_30;
  
  skiwi::save_compiler_data((skiwi *)script);
  if (skiwi::(anonymous_namespace)::cd != '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,script,&local_41);
    local_40 = skiwi::anon_unknown_1::compile(&local_38,&local_30,env,in_RCX);
    this_00._M_p = local_30._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      this_00._M_p = local_30._M_dataplus._M_p;
    }
    if (local_40 == (fptr)0x0) {
      uVar1 = 0x27;
    }
    else {
      uVar1 = (*local_40)(&DAT_002a8ee0);
      this_00._M_p = (pointer)&DAT_002a90e0;
      std::
      vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
      ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
                ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                  *)&DAT_002a90e0,(_func_unsigned_long_void_ptr_varargs **)&local_40,&local_38);
    }
    skiwi::restore_compiler_data((skiwi *)this_00._M_p);
    return uVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Skiwi is not initialized");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

uint64_t c_prim_eval(const char* script)
  {
  uint64_t return_value = skiwi_undefined;
  using namespace skiwi;
  /*
   void* rbx = cd.ctxt.rbx;
   void* rdi = cd.ctxt.rdi;
   void* rsi = cd.ctxt.rsi;
   void* rsp = cd.ctxt.rsp;
   void* rbp = cd.ctxt.rbp;
   void* r12 = cd.ctxt.r12;
   void* r13 = cd.ctxt.r13;
   void* r14 = cd.ctxt.r14;
   void* r15 = cd.ctxt.r15;
   uint64_t* rsp_save = cd.ctxt.rsp_save; // state of RSP should be preserved, as it might contain RET information and so on
   uint64_t* stack_save = cd.ctxt.stack_save; // stack_save contains the stack position at the beginning of the scheme call. After the scheme call the stack should be at this position again. Therefore this value needs to be preserved.
   uint64_t* error_label = cd.ctxt.error_label; // Each scheme call has its error label to which to jump in case of error. It should thus be preserved.
   */
  save_compiler_data();

  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");
  uint64_t size;
  auto f = compile(size, script, cd.env, cd.rd);
  if (f)
    {
#ifdef _SKIWI_FOR_ARM
    registers reg;
#ifdef _WIN32
    reg.rcx = (uint64_t)(&cd.ctxt);
#else
    reg.rdi = (uint64_t)(&cd.ctxt);
#endif
    run_bytecode(f, size, reg);
    cd.compiled_bytecode.emplace_back(f, size);
    return_value = reg.rax;
#else
    return_value = f(&cd.ctxt);
    cd.compiled_functions.emplace_back(f, size);
#endif
    }
  /*
   cd.ctxt.rbx = rbx;
   cd.ctxt.rdi = rdi;
   cd.ctxt.rsi = rsi;
   cd.ctxt.rsp = rsp;
   cd.ctxt.rbp = rbp;
   cd.ctxt.r12 = r12;
   cd.ctxt.r13 = r13;
   cd.ctxt.r14 = r14;
   cd.ctxt.r15 = r15;
   cd.ctxt.rsp_save = rsp_save;
   cd.ctxt.stack_save = stack_save;
   cd.ctxt.error_label = error_label;
   */
  restore_compiler_data();
  return return_value;
  }